

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

double rand_next(size_t *next)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  
  sVar1 = *next * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  *next = sVar1;
  auVar2._8_4_ = (int)(sVar1 >> 0x20);
  auVar2._0_8_ = sVar1;
  auVar2._12_4_ = 0x45300000;
  return ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 5.421010862427522e-20;
}

Assistant:

double rand_next( size_t * next ) 
{
#ifdef UINT64_MAX
  #if SIZE_MAX == UINT64_MAX
    return rand_next_uint64( (uint64_t *) next );
  #elif SIZE_MAX == UINT32_MAX
    return rand_next_uint32( (uint32_t *) next );
  #endif
#else
  return rand_next_uint32( (uint32_t *) next );
#endif
}